

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

EllSwiftPubKey * __thiscall
CKey::EllSwiftCreate(EllSwiftPubKey *__return_storage_ptr__,CKey *this,Span<const_std::byte> ent32)

{
  array<unsigned_char,_32UL> *seckey32;
  int iVar1;
  long in_FS_OFFSET;
  Span<const_std::byte> ellswift;
  array<std::byte,_64UL> encoded_pubkey;
  byte local_50 [64];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  seckey32 = (this->keydata)._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  if (seckey32 == (array<unsigned_char,_32UL> *)0x0) {
    __assert_fail("keydata",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x139,"EllSwiftPubKey CKey::EllSwiftCreate(Span<const std::byte>) const");
  }
  if (ent32.m_size != 0x20) {
    __assert_fail("ent32.size() == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x13a,"EllSwiftPubKey CKey::EllSwiftCreate(Span<const std::byte>) const");
  }
  iVar1 = secp256k1_ellswift_create(secp256k1_context_sign,local_50,seckey32->_M_elems,ent32.m_data)
  ;
  if (iVar1 == 0) {
    __assert_fail("success",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x143,"EllSwiftPubKey CKey::EllSwiftCreate(Span<const std::byte>) const");
  }
  ellswift.m_size = 0x40;
  ellswift.m_data = local_50;
  EllSwiftPubKey::EllSwiftPubKey(__return_storage_ptr__,ellswift);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

EllSwiftPubKey CKey::EllSwiftCreate(Span<const std::byte> ent32) const
{
    assert(keydata);
    assert(ent32.size() == 32);
    std::array<std::byte, EllSwiftPubKey::size()> encoded_pubkey;

    auto success = secp256k1_ellswift_create(secp256k1_context_sign,
                                             UCharCast(encoded_pubkey.data()),
                                             keydata->data(),
                                             UCharCast(ent32.data()));

    // Should always succeed for valid keys (asserted above).
    assert(success);
    return {encoded_pubkey};
}